

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

string * __thiscall pbrt::Disk::ToString_abi_cxx11_(Disk *this)

{
  bool *unaff_RBX;
  string *in_RDI;
  bool *unaff_retaddr;
  Transform *in_stack_00000008;
  Transform *in_stack_00000010;
  char *in_stack_00000018;
  float *in_stack_00000040;
  float *in_stack_00000048;
  float *in_stack_00000050;
  float *in_stack_00000058;
  
  StringPrintf<pbrt::Transform_const&,pbrt::Transform_const&,bool_const&,bool_const&,float_const&,float_const&,float_const&,float_const&>
            (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,unaff_RBX,
             in_stack_00000040,in_stack_00000048,in_stack_00000050,in_stack_00000058);
  return in_RDI;
}

Assistant:

std::string Disk::ToString() const {
    return StringPrintf(
        "[ Disk renderFromObject: %s objectFromRender: %s "
        "reverseOrientation: %s "
        "transformSwapsHandedness: %s height: %f radius: %f innerRadius: %f "
        "phiMax: %f ]",
        *renderFromObject, *objectFromRender, reverseOrientation,
        transformSwapsHandedness, height, radius, innerRadius, phiMax);
}